

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

value value_alloc(size_t bytes)

{
  long in_RDI;
  value_impl impl;
  undefined8 *local_8;
  
  local_8 = (undefined8 *)malloc(in_RDI + 0x28);
  if (local_8 == (undefined8 *)0x0) {
    local_8 = (undefined8 *)0x0;
  }
  else {
    *local_8 = "value_impl_magic_alloc";
    local_8[1] = in_RDI;
    local_8[2] = 1;
    local_8[3] = 0;
    local_8[4] = 0;
    local_8 = local_8 + 5;
  }
  return local_8;
}

Assistant:

value value_alloc(size_t bytes)
{
	value_impl impl = malloc(sizeof(struct value_impl_type) + bytes);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->magic = (uintptr_t)value_impl_magic_alloc;
	impl->bytes = bytes;
	impl->ref_count = 1;
	impl->finalizer = NULL;
	impl->finalizer_data = NULL;

	return (value)(((uintptr_t)impl) + sizeof(struct value_impl_type));
}